

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_prov_cipher.c
# Opt level: O0

int cipher_get_params(EVP_CIPHER *c,OSSL_PARAM *params)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 in_RSI;
  undefined8 in_RDI;
  OSSL_PARAM *p;
  int local_4;
  
  lVar2 = OSSL_PARAM_locate(in_RSI,"blocksize");
  if (lVar2 == 0) {
LAB_00111aa4:
    lVar2 = OSSL_PARAM_locate(in_RSI,"ivlen");
    if (lVar2 != 0) {
      iVar1 = EVP_CIPHER_get_iv_length(in_RDI);
      iVar1 = OSSL_PARAM_set_size_t(lVar2,(long)iVar1);
      if (iVar1 == 0) goto LAB_00111b6e;
    }
    lVar2 = OSSL_PARAM_locate(in_RSI,"keylen");
    if (lVar2 != 0) {
      iVar1 = EVP_CIPHER_get_key_length(in_RDI);
      iVar1 = OSSL_PARAM_set_size_t(lVar2,(long)iVar1);
      if (iVar1 == 0) goto LAB_00111b6e;
    }
    lVar2 = OSSL_PARAM_locate(in_RSI,"mode");
    if (lVar2 != 0) {
      uVar3 = EVP_CIPHER_get_flags(in_RDI);
      iVar1 = OSSL_PARAM_set_size_t(lVar2,uVar3);
      if (iVar1 == 0) goto LAB_00111b6e;
    }
    local_4 = 1;
  }
  else {
    iVar1 = EVP_CIPHER_get_block_size(in_RDI);
    iVar1 = OSSL_PARAM_set_size_t(lVar2,(long)iVar1);
    if (iVar1 != 0) goto LAB_00111aa4;
LAB_00111b6e:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int cipher_get_params(EVP_CIPHER *c, OSSL_PARAM params[])
{
    OSSL_PARAM *p;

    if (((p = OSSL_PARAM_locate(params, "blocksize")) != NULL
         && !OSSL_PARAM_set_size_t(p, EVP_CIPHER_block_size(c)))
        || ((p = OSSL_PARAM_locate(params, "ivlen")) != NULL
            && !OSSL_PARAM_set_size_t(p, EVP_CIPHER_iv_length(c)))
        || ((p = OSSL_PARAM_locate(params, "keylen")) != NULL
            && !OSSL_PARAM_set_size_t(p, EVP_CIPHER_key_length(c)))
        || ((p = OSSL_PARAM_locate(params, "mode")) != NULL
            && !OSSL_PARAM_set_size_t(p, EVP_CIPHER_flags(c))))
        return 0;
    return 1;
}